

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O0

void __thiscall
cmUVProcessChain::InternalData::SpawnProcess
          (InternalData *this,size_t index,ProcessConfiguration *config,bool first,bool last)

{
  anon_union_8_2_26168aa3_for_data aVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  reference this_00;
  type this_01;
  size_type __n;
  ulong uVar5;
  reference pvVar6;
  uv_stream_t *puVar7;
  __0 local_139;
  undefined8 local_138;
  uv_stream_t *puStack_130;
  undefined8 local_128;
  uv_stream_t *puStack_120;
  undefined1 local_110 [8];
  array<uv_stdio_container_s,_3UL> stdio;
  value_type local_d8;
  reference local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_a0 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> arguments;
  uv_process_options_t options;
  ProcessData *process;
  bool last_local;
  bool first_local;
  ProcessConfiguration *config_local;
  size_t index_local;
  InternalData *this_local;
  
  this_00 = std::
            vector<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
            ::operator[](&this->Processes,index);
  this_01 = std::
            unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
            ::operator*(this_00);
  arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&config->Arguments,0);
  std::__cxx11::string::c_str();
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_a0);
  __n = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::size(&config->Arguments);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_a0,__n);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&config->Arguments);
  arg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&config->Arguments);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&arg);
    if (!bVar3) break;
    local_d0 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    local_d8 = (value_type)std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_a0,&local_d8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  stdio._M_elems[2].data.stream = (uv_stream_t *)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_a0,
             (value_type *)&stdio._M_elems[2].data.stream);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::data
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_a0);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::__cxx11::string::c_str();
  }
  if (first) {
    pvVar6 = std::array<uv_stdio_container_s,_3UL>::operator[]
                       ((array<uv_stdio_container_s,_3UL> *)local_110,0);
    uVar2 = *(undefined4 *)&(this->InputStreamData).Stdio.field_0x4;
    pvVar6->flags = (this->InputStreamData).Stdio.flags;
    *(undefined4 *)&pvVar6->field_0x4 = uVar2;
    pvVar6->data = (this->InputStreamData).Stdio.data;
  }
  else {
    local_128 = 0;
    puStack_120 = (uv_stream_t *)0x0;
    pvVar6 = std::array<uv_stdio_container_s,_3UL>::operator[]
                       ((array<uv_stdio_container_s,_3UL> *)local_110,0);
    *(undefined8 *)pvVar6 = local_128;
    (pvVar6->data).stream = puStack_120;
    pvVar6 = std::array<uv_stdio_container_s,_3UL>::operator[]
                       ((array<uv_stdio_container_s,_3UL> *)local_110,0);
    pvVar6->flags = UV_INHERIT_STREAM;
    puVar7 = cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_(&this_01->InputPipe);
    pvVar6 = std::array<uv_stdio_container_s,_3UL>::operator[]
                       ((array<uv_stdio_container_s,_3UL> *)local_110,0);
    (pvVar6->data).stream = puVar7;
  }
  if (last) {
    pvVar6 = std::array<uv_stdio_container_s,_3UL>::operator[]
                       ((array<uv_stdio_container_s,_3UL> *)local_110,1);
    uVar2 = *(undefined4 *)&(this->OutputStreamData).Stdio.field_0x4;
    pvVar6->flags = (this->OutputStreamData).Stdio.flags;
    *(undefined4 *)&pvVar6->field_0x4 = uVar2;
    pvVar6->data = (this->OutputStreamData).Stdio.data;
  }
  else {
    local_138 = 0;
    puStack_130 = (uv_stream_t *)0x0;
    pvVar6 = std::array<uv_stdio_container_s,_3UL>::operator[]
                       ((array<uv_stdio_container_s,_3UL> *)local_110,1);
    *(undefined8 *)pvVar6 = local_138;
    (pvVar6->data).stream = puStack_130;
    pvVar6 = std::array<uv_stdio_container_s,_3UL>::operator[]
                       ((array<uv_stdio_container_s,_3UL> *)local_110,1);
    pvVar6->flags = UV_INHERIT_STREAM;
    puVar7 = cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_(&this_01->OutputPipe);
    pvVar6 = std::array<uv_stdio_container_s,_3UL>::operator[]
                       ((array<uv_stdio_container_s,_3UL> *)local_110,1);
    (pvVar6->data).stream = puVar7;
  }
  pvVar6 = std::array<uv_stdio_container_s,_3UL>::operator[]
                     ((array<uv_stdio_container_s,_3UL> *)local_110,2);
  uVar2 = *(undefined4 *)&(this->ErrorStreamData).Stdio.field_0x4;
  aVar1 = (this->ErrorStreamData).Stdio.data;
  pvVar6->flags = (this->ErrorStreamData).Stdio.flags;
  *(undefined4 *)&pvVar6->field_0x4 = uVar2;
  pvVar6->data = aVar1;
  std::array<uv_stdio_container_s,_3UL>::data((array<uv_stdio_container_s,_3UL> *)local_110);
  arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)SpawnProcess(unsigned_long,cmUVProcessChainBuilder::ProcessConfiguration_const&,bool,bool)
                ::$_0::operator_cast_to_function_pointer(&local_139);
  iVar4 = cm::uv_process_ptr::spawn
                    (&this_01->Process,this->Loop,
                     (uv_process_options_t *)
                     &arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,this_01);
  (this_01->ProcessStatus).SpawnResult = iVar4;
  if (iVar4 < 0) {
    ProcessData::Finish(this_01);
  }
  cm::uv_handle_ptr_base_<uv_pipe_s>::reset((uv_handle_ptr_base_<uv_pipe_s> *)&this_01->InputPipe);
  cm::uv_handle_ptr_base_<uv_pipe_s>::reset((uv_handle_ptr_base_<uv_pipe_s> *)&this_01->OutputPipe);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_a0);
  return;
}

Assistant:

void cmUVProcessChain::InternalData::SpawnProcess(
  std::size_t index,
  const cmUVProcessChainBuilder::ProcessConfiguration& config, bool first,
  bool last)
{
  auto& process = *this->Processes[index];

  auto options = uv_process_options_t();

  // Bounds were checked at add time, first element is guaranteed to exist
  options.file = config.Arguments[0].c_str();

  std::vector<const char*> arguments;
  arguments.reserve(config.Arguments.size());
  for (auto const& arg : config.Arguments) {
    arguments.push_back(arg.c_str());
  }
  arguments.push_back(nullptr);
  options.args = const_cast<char**>(arguments.data());
  options.flags = UV_PROCESS_WINDOWS_HIDE;
#if UV_VERSION_MAJOR > 1 ||                                                   \
  (UV_VERSION_MAJOR == 1 && UV_VERSION_MINOR >= 48) ||                        \
  !defined(CMAKE_USE_SYSTEM_LIBUV)
  options.flags |= UV_PROCESS_WINDOWS_FILE_PATH_EXACT_NAME;
#endif
  if (!this->Builder->WorkingDirectory.empty()) {
    options.cwd = this->Builder->WorkingDirectory.c_str();
  }

  std::array<uv_stdio_container_t, 3> stdio;
  if (first) {
    stdio[0] = this->InputStreamData.Stdio;
  } else {
    stdio[0] = uv_stdio_container_t();
    stdio[0].flags = UV_INHERIT_STREAM;
    stdio[0].data.stream = process.InputPipe;
  }
  if (last) {
    stdio[1] = this->OutputStreamData.Stdio;
  } else {
    stdio[1] = uv_stdio_container_t();
    stdio[1].flags = UV_INHERIT_STREAM;
    stdio[1].data.stream = process.OutputPipe;
  }
  stdio[2] = this->ErrorStreamData.Stdio;

  options.stdio = stdio.data();
  options.stdio_count = 3;
  options.exit_cb = [](uv_process_t* handle, int64_t exitStatus,
                       int termSignal) {
    auto* processData = static_cast<ProcessData*>(handle->data);
    processData->ProcessStatus.ExitStatus = exitStatus;
    processData->ProcessStatus.TermSignal = termSignal;
    processData->Finish();
  };

  if ((process.ProcessStatus.SpawnResult =
         process.Process.spawn(*this->Loop, options, &process)) < 0) {
    process.Finish();
  }
  process.InputPipe.reset();
  process.OutputPipe.reset();
}